

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

IndexVector * __thiscall
Centaurus::CharClass<char>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<char> *this)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  uint local_58 [5];
  uint local_44;
  reference local_40;
  Range<char> *r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *__range2;
  CharClass<char> *this_local;
  IndexVector *ret;
  
  sVar3 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::size
                    (&this->m_ranges);
  IndexVector::IndexVector(__return_storage_ptr__,sVar3 << 1,true);
  __end0 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::begin
                     (&this->m_ranges);
  r = (Range<char> *)
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::end
                (&this->m_ranges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                                     *)&r), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator*(&__end0);
    bVar2 = Range<char>::start(local_40);
    local_44 = (uint)bVar2;
    std::vector<int,_std::allocator<int>_>::push_back
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
               (value_type *)&local_44);
    bVar2 = Range<char>::end(local_40);
    local_58[0] = (uint)bVar2;
    std::vector<int,_std::allocator<int>_>::push_back
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
               (value_type *)local_58);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }